

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O3

void __thiscall EnvironmentNAVXYTHETALAT::~EnvironmentNAVXYTHETALAT(EnvironmentNAVXYTHETALAT *this)

{
  vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_> *pvVar1;
  void *pvVar2;
  pointer ppEVar3;
  pointer ppEVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  pointer *pppEVar8;
  
  (this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
  _vptr_DiscreteSpaceInformation = (_func_int **)&PTR_InitializeEnv_001577d0;
  ppEVar3 = (this->StateID2CoordTable).
            super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppEVar4 = (this->StateID2CoordTable).
            super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)ppEVar4 - (long)ppEVar3 >> 3;
  if (0 < (int)uVar5) {
    uVar7 = 0;
    do {
      if (uVar5 <= uVar7) {
LAB_001299fd:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7
                  );
      }
      operator_delete(ppEVar3[uVar7],0x14);
      ppEVar3 = (this->StateID2CoordTable).
                super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->StateID2CoordTable).
                        super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3) <= uVar7)
      goto LAB_001299fd;
      ppEVar3[uVar7] = (EnvNAVXYTHETALATHashEntry_t *)0x0;
      uVar7 = uVar7 + 1;
      ppEVar3 = (this->StateID2CoordTable).
                super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppEVar4 = (this->StateID2CoordTable).
                super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar5 = (long)ppEVar4 - (long)ppEVar3 >> 3;
    } while ((long)uVar7 < (long)(int)((ulong)((long)ppEVar4 - (long)ppEVar3) >> 3));
  }
  if (ppEVar4 != ppEVar3) {
    (this->StateID2CoordTable).
    super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppEVar3;
  }
  pvVar1 = this->Coord2StateIDHashTable;
  if (pvVar1 != (vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                 *)0x0) {
    ppEVar3 = pvVar1[-1].
              super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pppEVar8 = &pvVar1[-1].
                super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (ppEVar3 != (pointer)0x0) {
      lVar6 = (long)ppEVar3 * 0x18;
      do {
        pvVar2 = *(void **)((long)&pvVar1[-1].
                                   super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar6);
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2,*(long *)((long)pppEVar8 + lVar6) - (long)pvVar2);
        }
        lVar6 = lVar6 + -0x18;
      } while (lVar6 != 0);
    }
    operator_delete__(pppEVar8,(long)ppEVar3 * 0x18 + 8);
    this->Coord2StateIDHashTable =
         (vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_> *)
         0x0;
  }
  if (this->Coord2StateIDHashTable_lookup != (EnvNAVXYTHETALATHashEntry_t **)0x0) {
    operator_delete__(this->Coord2StateIDHashTable_lookup);
    this->Coord2StateIDHashTable_lookup = (EnvNAVXYTHETALATHashEntry_t **)0x0;
  }
  ppEVar3 = (this->StateID2CoordTable).
            super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar3 != (pointer)0x0) {
    operator_delete(ppEVar3,(long)(this->StateID2CoordTable).
                                  super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar3
                   );
  }
  EnvironmentNAVXYTHETALATTICE::~EnvironmentNAVXYTHETALATTICE
            (&this->super_EnvironmentNAVXYTHETALATTICE);
  return;
}

Assistant:

EnvironmentNAVXYTHETALAT::~EnvironmentNAVXYTHETALAT()
{
    SBPL_PRINTF("destroying XYTHETALAT\n");

    // delete the states themselves first
    for (int i = 0; i < (int)StateID2CoordTable.size(); i++) {
        delete StateID2CoordTable.at(i);
        StateID2CoordTable.at(i) = NULL;
    }
    StateID2CoordTable.clear();

    // delete hashtable
    if (Coord2StateIDHashTable != NULL) {
        delete[] Coord2StateIDHashTable;
        Coord2StateIDHashTable = NULL;
    }
    if (Coord2StateIDHashTable_lookup != NULL) {
        delete[] Coord2StateIDHashTable_lookup;
        Coord2StateIDHashTable_lookup = NULL;
    }
}